

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferGLImpl::UpdateData
          (BufferGLImpl *this,GLContextState *CtxState,Uint64 Offset,Uint64 Size,void *pData)

{
  uint uVar1;
  GLenum err;
  string msg;
  uint local_54;
  undefined1 local_50 [32];
  
  BufferMemoryBarrier(this,MEMORY_BARRIER_BUFFER_UPDATE,CtxState);
  uVar1 = this->m_BindTarget & 0xfffffffe;
  GLContextState::BindBuffer(CtxState,this->m_BindTarget,&this->m_GlBuffer,uVar1 == 0x8892);
  (*__glewBufferSubData)(this->m_BindTarget,Offset,Size,pData);
  local_54 = glGetError();
  if (local_54 != 0) {
    LogError<false,char[25],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xe8,(char (*) [25])"glBufferSubData() failed",(char (*) [17])"\nGL Error Code: ",
               &local_54);
    FormatString<char[6]>((string *)local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xe8);
    std::__cxx11::string::~string((string *)local_50);
  }
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = 0;
  GLContextState::BindBuffer(CtxState,this->m_BindTarget,(GLBufferObj *)local_50,uVar1 == 0x8892);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_50);
  return;
}

Assistant:

void BufferGLImpl::UpdateData(GLContextState& CtxState, Uint64 Offset, Uint64 Size, const void* pData)
{
    BufferMemoryBarrier(
        MEMORY_BARRIER_BUFFER_UPDATE, // Reads or writes to buffer objects via any OpenGL API functions that allow
                                      // modifying their contents will reflect data written by shaders prior to the barrier.
                                      // Additionally, writes via these commands issued after the barrier will wait on
                                      // the completion of any shader writes to the same memory initiated prior to the barrier.
        CtxState);

    // We must unbind VAO because otherwise we will break the bindings
    const auto ResetVAO = m_BindTarget == GL_ARRAY_BUFFER || m_BindTarget == GL_ELEMENT_ARRAY_BUFFER;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);
    // All buffer bind targets (GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER etc.) relate to the same
    // kind of objects. As a result they are all equivalent from a transfer point of view.
    glBufferSubData(m_BindTarget, StaticCast<GLintptr>(Offset), StaticCast<GLsizeiptr>(Size), pData);
    DEV_CHECK_GL_ERROR("glBufferSubData() failed");
    CtxState.BindBuffer(m_BindTarget, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);
}